

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O0

int __thiscall QDialog::open(QDialog *this,char *__file,int __oflag,...)

{
  undefined8 uVar1;
  bool bVar2;
  WindowModality WVar3;
  int extraout_EAX;
  QDialogPrivate *this_00;
  WindowModality modality;
  QDialogPrivate *d;
  bool bStack0000000000000043;
  WidgetAttribute WStack0000000000000044;
  undefined8 in_stack_00000040;
  QWidget *in_stack_00000048;
  WindowModality in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = in_stack_00000040;
  WStack0000000000000044 = (WidgetAttribute)((ulong)in_stack_00000040 >> 0x20);
  bStack0000000000000043 = SUB81((ulong)uVar1 >> 0x18,0);
  this_00 = d_func((QDialog *)0x743b1c);
  WVar3 = QWidget::windowModality(&this->super_QWidget);
  if (WVar3 != WindowModal) {
    this_00->resetModalityTo = WVar3;
    bVar2 = QWidget::testAttribute
                      ((QWidget *)CONCAT44(WVar3,in_stack_ffffffffffffffe8),
                       (WidgetAttribute)((ulong)this >> 0x20));
    this_00->wasModalitySet = bVar2;
    QWidget::setWindowModality(&this->super_QWidget,in_stack_ffffffffffffffdc);
    QWidget::setAttribute(in_stack_00000048,WStack0000000000000044,bStack0000000000000043);
  }
  setResult(this,in_stack_ffffffffffffffdc);
  QWidget::show((QWidget *)this_00);
  return extraout_EAX;
}

Assistant:

void QDialog::open()
{
    Q_D(QDialog);

    Qt::WindowModality modality = windowModality();
    if (modality != Qt::WindowModal) {
        d->resetModalityTo = modality;
        d->wasModalitySet = testAttribute(Qt::WA_SetWindowModality);
        setWindowModality(Qt::WindowModal);
        setAttribute(Qt::WA_SetWindowModality, false);
#ifdef Q_OS_MAC
        setParent(parentWidget(), Qt::Sheet);
#endif
    }

    setResult(0);
    show();
}